

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

void __thiscall RTQuaternion::fromEuler(RTQuaternion *this,RTVector3 *vec)

{
  RTFLOAT RVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  double dVar8;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  RTFLOAT sinZ2;
  RTFLOAT cosZ2;
  RTFLOAT sinY2;
  RTFLOAT cosY2;
  RTFLOAT sinX2;
  RTFLOAT cosX2;
  RTVector3 *vec_local;
  RTQuaternion *this_local;
  
  RVar1 = RTVector3::x(vec);
  dVar8 = std::cos((double)CONCAT44(extraout_XMM0_Db,RVar1 / 2.0));
  fVar2 = SUB84(dVar8,0);
  RVar1 = RTVector3::x(vec);
  dVar8 = std::sin((double)CONCAT44(extraout_XMM0_Db_00,RVar1 / 2.0));
  fVar3 = SUB84(dVar8,0);
  RVar1 = RTVector3::y(vec);
  dVar8 = std::cos((double)CONCAT44(extraout_XMM0_Db_01,RVar1 / 2.0));
  fVar4 = SUB84(dVar8,0);
  RVar1 = RTVector3::y(vec);
  dVar8 = std::sin((double)CONCAT44(extraout_XMM0_Db_02,RVar1 / 2.0));
  fVar5 = SUB84(dVar8,0);
  RVar1 = RTVector3::z(vec);
  dVar8 = std::cos((double)CONCAT44(extraout_XMM0_Db_03,RVar1 / 2.0));
  fVar6 = SUB84(dVar8,0);
  RVar1 = RTVector3::z(vec);
  dVar8 = std::sin((double)CONCAT44(extraout_XMM0_Db_04,RVar1 / 2.0));
  fVar7 = SUB84(dVar8,0);
  this->m_data[0] = fVar2 * fVar4 * fVar6 + fVar3 * fVar5 * fVar7;
  this->m_data[1] = fVar3 * fVar4 * fVar6 + -(fVar2 * fVar5 * fVar7);
  this->m_data[2] = fVar2 * fVar5 * fVar6 + fVar3 * fVar4 * fVar7;
  this->m_data[3] = fVar2 * fVar4 * fVar7 + -(fVar3 * fVar5 * fVar6);
  normalize(this);
  return;
}

Assistant:

void RTQuaternion::fromEuler(RTVector3& vec)
{
    RTFLOAT cosX2 = cos(vec.x() / 2.0f);
    RTFLOAT sinX2 = sin(vec.x() / 2.0f);
    RTFLOAT cosY2 = cos(vec.y() / 2.0f);
    RTFLOAT sinY2 = sin(vec.y() / 2.0f);
    RTFLOAT cosZ2 = cos(vec.z() / 2.0f);
    RTFLOAT sinZ2 = sin(vec.z() / 2.0f);

    m_data[0] = cosX2 * cosY2 * cosZ2 + sinX2 * sinY2 * sinZ2;
    m_data[1] = sinX2 * cosY2 * cosZ2 - cosX2 * sinY2 * sinZ2;
    m_data[2] = cosX2 * sinY2 * cosZ2 + sinX2 * cosY2 * sinZ2;
    m_data[3] = cosX2 * cosY2 * sinZ2 - sinX2 * sinY2 * cosZ2;
    normalize();
}